

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O3

void __thiscall soplex::SPxBasisBase<double>::removedRows(SPxBasisBase<double> *this,int *perm)

{
  uint uVar1;
  uint uVar2;
  Status *pSVar3;
  ulong uVar4;
  
  uVar1 = (this->thedesc).rowstat.thesize;
  if (this->theLP->theRep == ROW) {
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        uVar2 = perm[uVar4];
        if (uVar4 != uVar2) {
          if ((int)uVar2 < 0) {
            if (0 < this->theLP->theRep * (this->thedesc).rowstat.data[uVar4]) {
              if (this->thestatus != NO_PROBLEM) {
                this->thestatus = NO_PROBLEM;
                invalidate(this);
              }
              this->matrixIsSetup = false;
              this->factorized = false;
            }
          }
          else {
            pSVar3 = (this->thedesc).rowstat.data;
            pSVar3[uVar2] = pSVar3[uVar4];
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  else {
    this->factorized = false;
    this->matrixIsSetup = false;
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        uVar2 = perm[uVar4];
        if (uVar4 != uVar2) {
          if ((int)uVar2 < 0) {
            if ((this->theLP->theRep * (this->thedesc).rowstat.data[uVar4] < 1) &&
               (this->thestatus != NO_PROBLEM)) {
              this->thestatus = NO_PROBLEM;
              invalidate(this);
            }
          }
          else {
            pSVar3 = (this->thedesc).rowstat.data;
            pSVar3[uVar2] = pSVar3[uVar4];
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  reDim(this);
  return;
}

Assistant:

void SPxBasisBase<R>::removedRows(const int perm[])
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);

   int i;
   int n = thedesc.nRows();

   if(theLP->rep() == SPxSolverBase<R>::ROW)
   {
      for(i = 0; i < n; ++i)
      {
         if(perm[i] != i)
         {
            if(perm[i] < 0)                // row got removed
            {
               if(theLP->isBasic(thedesc.rowStatus(i)))
               {
                  setStatus(NO_PROBLEM);
                  factorized = matrixIsSetup = false;
                  SPxOut::debug(this, "DCHBAS07 Warning: deleting basic row!\n");
               }
            }
            else                            // row was moved
               thedesc.rowStatus(perm[i]) = thedesc.rowStatus(i);
         }
      }
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::COLUMN);

      factorized    = false;
      matrixIsSetup = false;

      for(i = 0; i < n; ++i)
      {
         if(perm[i] != i)
         {
            if(perm[i] < 0)                // row got removed
            {
               if(!theLP->isBasic(thedesc.rowStatus(i)))
                  setStatus(NO_PROBLEM);
            }
            else                            // row was moved
               thedesc.rowStatus(perm[i]) = thedesc.rowStatus(i);
         }
      }
   }

   reDim();
}